

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_filter.cpp
# Opt level: O3

void __thiscall duckdb::AdaptiveFilter::AdaptRuntimeStatistics(AdaptiveFilter *this,double duration)

{
  value_type vVar1;
  uint max;
  uint32_t uVar2;
  idx_t iVar3;
  reference pvVar4;
  reference pvVar5;
  ulong __n;
  double dVar6;
  undefined1 auVar7 [16];
  undefined4 uVar9;
  undefined1 auVar8 [16];
  
  iVar3 = this->iteration_count + 1;
  this->iteration_count = iVar3;
  dVar6 = duration + this->runtime_sum;
  this->runtime_sum = dVar6;
  if (this->warmup == false) {
    uVar9 = (undefined4)(iVar3 >> 0x20);
    if (this->observe == true) {
      if (iVar3 != this->observe_interval) {
        return;
      }
      auVar8._8_4_ = uVar9;
      auVar8._0_8_ = iVar3;
      auVar8._12_4_ = 0x45300000;
      if (this->prev_mean -
          dVar6 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)iVar3) - 4503599627370496.0)) <= 0.0) {
        pvVar4 = vector<unsigned_long,_true>::operator[](&this->permutation,this->swap_idx);
        pvVar5 = vector<unsigned_long,_true>::operator[](&this->permutation,this->swap_idx + 1);
        vVar1 = *pvVar4;
        *pvVar4 = *pvVar5;
        *pvVar5 = vVar1;
        pvVar4 = vector<unsigned_long,_true>::operator[](&this->swap_likeliness,this->swap_idx);
        if (1 < *pvVar4) {
          pvVar4 = vector<unsigned_long,_true>::operator[](&this->swap_likeliness,this->swap_idx);
          *pvVar4 = *pvVar4 >> 1;
        }
      }
      else {
        pvVar4 = vector<unsigned_long,_true>::operator[](&this->swap_likeliness,this->swap_idx);
        *pvVar4 = 100;
      }
      this->observe = false;
    }
    else {
      if (iVar3 != this->execute_interval) {
        return;
      }
      auVar7._8_4_ = uVar9;
      auVar7._0_8_ = iVar3;
      auVar7._12_4_ = 0x45300000;
      this->prev_mean =
           dVar6 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)iVar3) - 4503599627370496.0));
      max = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(this->right_random_border);
      uVar2 = RandomEngine::NextRandomInteger(&this->generator,1,max);
      __n = (ulong)uVar2 / 100;
      this->swap_idx = __n;
      pvVar4 = vector<unsigned_long,_true>::operator[](&this->swap_likeliness,__n);
      if ((ulong)uVar2 % 100 < *pvVar4) {
        pvVar4 = vector<unsigned_long,_true>::operator[](&this->permutation,this->swap_idx);
        pvVar5 = vector<unsigned_long,_true>::operator[](&this->permutation,this->swap_idx + 1);
        vVar1 = *pvVar4;
        *pvVar4 = *pvVar5;
        *pvVar5 = vVar1;
        this->observe = true;
      }
    }
    this->iteration_count = 0;
    this->runtime_sum = 0.0;
  }
  else if (iVar3 == 5) {
    this->iteration_count = 0;
    this->runtime_sum = 0.0;
    this->observe = false;
    this->warmup = false;
  }
  return;
}

Assistant:

void AdaptiveFilter::AdaptRuntimeStatistics(double duration) {
	iteration_count++;
	runtime_sum += duration;

	D_ASSERT(!disable_permutations);
	if (!warmup) {
		// the last swap was observed
		if (observe && iteration_count == observe_interval) {
			// keep swap if runtime decreased, else reverse swap
			if (prev_mean - (runtime_sum / static_cast<double>(iteration_count)) <= 0) {
				// reverse swap because runtime didn't decrease
				std::swap(permutation[swap_idx], permutation[swap_idx + 1]);

				// decrease swap likeliness, but make sure there is always a small likeliness left
				if (swap_likeliness[swap_idx] > 1) {
					swap_likeliness[swap_idx] /= 2;
				}
			} else {
				// keep swap because runtime decreased, reset likeliness
				swap_likeliness[swap_idx] = 100;
			}
			observe = false;

			// reset values
			iteration_count = 0;
			runtime_sum = 0.0;
		} else if (!observe && iteration_count == execute_interval) {
			// save old mean to evaluate swap
			prev_mean = runtime_sum / static_cast<double>(iteration_count);

			// get swap index and swap likeliness
			// a <= i <= b
			auto random_number = generator.NextRandomInteger(1, NumericCast<uint32_t>(right_random_border));

			swap_idx = random_number / 100;                    // index to be swapped
			idx_t likeliness = random_number - 100 * swap_idx; // random number between [0, 100)

			// check if swap is going to happen
			if (swap_likeliness[swap_idx] > likeliness) { // always true for the first swap of an index
				// swap
				std::swap(permutation[swap_idx], permutation[swap_idx + 1]);

				// observe whether swap will be applied
				observe = true;
			}

			// reset values
			iteration_count = 0;
			runtime_sum = 0.0;
		}
	} else {
		if (iteration_count == 5) {
			// initially set all values
			iteration_count = 0;
			runtime_sum = 0.0;
			observe = false;
			warmup = false;
		}
	}
}